

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SerializeMessageNoTable(MessageLite *msg,ArrayOutput *output)

{
  uint8_t *puVar1;
  ZeroCopyOutputStream **ppZVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  int64_t iVar5;
  uint8_t *ptr;
  int size;
  void *data;
  CodedOutputStream o;
  ArrayOutputStream array_stream;
  uint local_9c;
  EpsCopyOutputStream *local_98;
  CodedOutputStream local_90;
  ArrayOutputStream local_40;
  
  io::ArrayOutputStream::ArrayOutputStream(&local_40,output->ptr,0x7fffffff,-1);
  local_90.impl_.is_serialization_deterministic_ =
       (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  puVar1 = local_90.impl_.buffer_;
  local_90.impl_.had_error_ = false;
  local_90.impl_.aliasing_enabled_ = false;
  local_90.impl_.skip_check_consistency = false;
  local_90.impl_.end_ = puVar1;
  local_90.impl_.buffer_end_ = puVar1;
  local_90.impl_.stream_ = &local_40.super_ZeroCopyOutputStream;
  local_90.cur_ = puVar1;
  local_90.start_count_ = io::ArrayOutputStream::ByteCount(&local_40);
  bVar3 = io::ArrayOutputStream::Next(&local_40,&local_98,(int *)&local_9c);
  if ((bVar3) && (0 < (int)local_9c)) {
    ppZVar2 = &local_98[-1].stream_;
    if ((int)local_9c < 0x11) {
      ppZVar2 = (ZeroCopyOutputStream **)puVar1;
    }
    local_90.impl_.end_ = (uint8_t *)((long)ppZVar2 + (ulong)local_9c);
    local_90.impl_.buffer_end_ = (uint8_t *)local_98;
    local_90.cur_ = puVar1;
    if (0x10 < (int)local_9c) {
      local_90.impl_.buffer_end_ = (uint8_t *)(EpsCopyOutputStream *)0x0;
      local_90.cur_ = (uint8_t *)local_98;
    }
  }
  local_90.impl_.is_serialization_deterministic_ = output->is_deterministic;
  iVar4 = (*msg->_vptr_MessageLite[5])(msg,local_90.cur_);
  local_90.cur_ = (uint8_t *)CONCAT44(extraout_var,iVar4);
  iVar5 = io::EpsCopyOutputStream::ByteCount(&local_90.impl_,local_90.cur_);
  output->ptr = output->ptr + ((int)iVar5 - (int)local_90.start_count_);
  io::CodedOutputStream::~CodedOutputStream(&local_90);
  return;
}

Assistant:

void SerializeMessageNoTable(const MessageLite* msg, ArrayOutput* output) {
  io::ArrayOutputStream array_stream(output->ptr, INT_MAX);
  io::CodedOutputStream o(&array_stream);
  o.SetSerializationDeterministic(output->is_deterministic);
  msg->SerializeWithCachedSizes(&o);
  output->ptr += o.ByteCount();
}